

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflection.cpp
# Opt level: O0

Offset<const_flatbuffers::Table_*>
flatbuffers::CopyTable
          (FlatBufferBuilder *fbb,Schema *schema,Object *objectdef,Table *table,
          bool use_string_pooling)

{
  Field *fielddef_00;
  const_iterator cVar1;
  pointer objectdef_00;
  bool bVar2;
  uint16_t uVar3;
  BaseType BVar4;
  uint uVar5;
  Offset<const_flatbuffers::Table_*> OVar6;
  uint uVar7;
  int32_t iVar8;
  int32_t iVar9;
  uoffset_t uVar10;
  String *pSVar11;
  return_type this;
  Object *objectdef_01;
  Table *pTVar12;
  Vector<flatbuffers::Offset<flatbuffers::Table>,_unsigned_int> *this_00;
  return_type pSVar13;
  reference pvVar14;
  return_type table_00;
  reference pvVar15;
  uint8_t *bytes;
  Type *pTVar16;
  Vector<flatbuffers::Offset<reflection::Object>,_unsigned_int> *pVVar17;
  char *pcVar18;
  reference pvVar19;
  size_t sVar20;
  uchar *puVar21;
  int __c;
  int __c_00;
  int __c_01;
  uoffset_t local_3d8;
  offset_type local_308;
  pointer local_2d0;
  offset_type local_1f0;
  size_t size;
  Object *local_178;
  Object *subobjectdef_2;
  Field *pFStack_168;
  BaseType base_type;
  Field *fielddef_1;
  VectorIterator<flatbuffers::Offset<reflection::Field>,_const_reflection::Field_*,_const_unsigned_char_*,_unsigned_int>
  local_158;
  const_iterator it_1;
  size_t offset_idx;
  uoffset_t start;
  size_t element_alignment;
  size_t element_size;
  uint local_128;
  allocator<flatbuffers::Offset<const_flatbuffers::Table_*>_> local_121;
  uoffset_t i_1;
  vector<flatbuffers::Offset<const_flatbuffers::Table_*>,_std::allocator<flatbuffers::Offset<const_flatbuffers::Table_*>_>_>
  elements_1;
  Offset<const_flatbuffers::String_*> local_f8;
  uint local_f4;
  Vector<flatbuffers::Offset<flatbuffers::Table>,_unsigned_int> *pVStack_f0;
  uoffset_t i;
  Vector<flatbuffers::Offset<flatbuffers::String>,_unsigned_int> *vec_s;
  undefined1 local_e0 [8];
  vector<flatbuffers::Offset<const_flatbuffers::String_*>,_std::allocator<flatbuffers::Offset<const_flatbuffers::String_*>_>_>
  elements;
  return_type elemobjectdef;
  BaseType element_base_type;
  Vector<flatbuffers::Offset<flatbuffers::Table>,_unsigned_int> *vec;
  Object *subobjectdef_1;
  Object *subobjectdef;
  value_type_conflict4 local_84;
  Field *pFStack_80;
  uoffset_t offset;
  Field *fielddef;
  VectorIterator<flatbuffers::Offset<reflection::Field>,_const_reflection::Field_*,_const_unsigned_char_*,_unsigned_int>
  local_70;
  const_iterator it;
  Vector<flatbuffers::Offset<reflection::Field>,_unsigned_int> *fielddefs;
  vector<unsigned_int,_std::allocator<unsigned_int>_> offsets;
  bool use_string_pooling_local;
  Table *table_local;
  Object *objectdef_local;
  Schema *schema_local;
  FlatBufferBuilder *fbb_local;
  
  offsets.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._7_1_ = use_string_pooling;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&fielddefs);
  reflection::Object::fields(objectdef);
  Vector<flatbuffers::Offset<reflection::Field>,_unsigned_int>::begin
            ((Vector<flatbuffers::Offset<reflection::Field>,_unsigned_int> *)&local_70);
  while( true ) {
    Vector<flatbuffers::Offset<reflection::Field>,_unsigned_int>::end
              ((Vector<flatbuffers::Offset<reflection::Field>,_unsigned_int> *)&fielddef);
    bVar2 = VectorIterator<flatbuffers::Offset<reflection::Field>,_const_reflection::Field_*,_const_unsigned_char_*,_unsigned_int>
            ::operator!=(&local_70,
                         (VectorIterator<flatbuffers::Offset<reflection::Field>,_const_reflection::Field_*,_const_unsigned_char_*,_unsigned_int>
                          *)&fielddef);
    if (!bVar2) break;
    pFStack_80 = VectorIterator<flatbuffers::Offset<reflection::Field>,_const_reflection::Field_*,_const_unsigned_char_*,_unsigned_int>
                 ::operator*(&local_70);
    uVar3 = reflection::Field::offset(pFStack_80);
    pcVar18 = (char *)(ulong)uVar3;
    bVar2 = Table::CheckField(table,uVar3);
    if (bVar2) {
      local_84 = 0;
      pTVar16 = reflection::Field::type(pFStack_80);
      BVar4 = reflection::Type::base_type(pTVar16);
      switch(BVar4) {
      case String:
        if ((offsets.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage._7_1_ & 1) == 0) {
          pSVar11 = GetFieldS(table,pFStack_80);
          local_1f0 = (offset_type)
                      FlatBufferBuilderImpl<false>::CreateString<flatbuffers::Offset>(fbb,pSVar11);
        }
        else {
          pSVar11 = GetFieldS(table,pFStack_80);
          local_1f0 = (offset_type)FlatBufferBuilderImpl<false>::CreateSharedString(fbb,pSVar11);
        }
        local_84 = local_1f0;
        break;
      case Vector:
        uVar3 = reflection::Field::offset(pFStack_80);
        pcVar18 = (char *)(ulong)uVar3;
        this_00 = Table::
                  GetPointer<flatbuffers::Vector<flatbuffers::Offset<flatbuffers::Table>,unsigned_int>const*,unsigned_int>
                            (table,uVar3);
        pTVar16 = reflection::Field::type(pFStack_80);
        BVar4 = reflection::Type::element(pTVar16);
        if (BVar4 == Obj) {
          pVVar17 = reflection::Schema::objects(schema);
          pTVar16 = reflection::Field::type(pFStack_80);
          pcVar18 = reflection::Type::index(pTVar16,pcVar18,__c_00);
          local_2d0 = (pointer)Vector<flatbuffers::Offset<reflection::Object>,_unsigned_int>::Get
                                         (pVVar17,(uint)pcVar18);
        }
        else {
          local_2d0 = (pointer)0x0;
        }
        elements.
        super__Vector_base<flatbuffers::Offset<const_flatbuffers::String_*>,_std::allocator<flatbuffers::Offset<const_flatbuffers::String_*>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = local_2d0;
        if (BVar4 == String) {
          uVar7 = Vector<flatbuffers::Offset<flatbuffers::Table>,_unsigned_int>::size(this_00);
          std::allocator<flatbuffers::Offset<const_flatbuffers::String_*>_>::allocator
                    ((allocator<flatbuffers::Offset<const_flatbuffers::String_*>_> *)
                     ((long)&vec_s + 7));
          std::
          vector<flatbuffers::Offset<const_flatbuffers::String_*>,_std::allocator<flatbuffers::Offset<const_flatbuffers::String_*>_>_>
          ::vector((vector<flatbuffers::Offset<const_flatbuffers::String_*>,_std::allocator<flatbuffers::Offset<const_flatbuffers::String_*>_>_>
                    *)local_e0,(ulong)uVar7,
                   (allocator<flatbuffers::Offset<const_flatbuffers::String_*>_> *)
                   ((long)&vec_s + 7));
          std::allocator<flatbuffers::Offset<const_flatbuffers::String_*>_>::~allocator
                    ((allocator<flatbuffers::Offset<const_flatbuffers::String_*>_> *)
                     ((long)&vec_s + 7));
          pVStack_f0 = this_00;
          for (local_f4 = 0; uVar7 = local_f4,
              uVar5 = Vector<flatbuffers::Offset<flatbuffers::String>,_unsigned_int>::size
                                ((Vector<flatbuffers::Offset<flatbuffers::String>,_unsigned_int> *)
                                 pVStack_f0), uVar7 < uVar5; local_f4 = local_f4 + 1) {
            if ((offsets.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage._7_1_ & 1) == 0) {
              pSVar13 = Vector<flatbuffers::Offset<flatbuffers::String>,_unsigned_int>::Get
                                  ((Vector<flatbuffers::Offset<flatbuffers::String>,_unsigned_int> *
                                   )pVStack_f0,local_f4);
              local_308 = (offset_type)
                          FlatBufferBuilderImpl<false>::CreateString<flatbuffers::Offset>
                                    (fbb,pSVar13);
            }
            else {
              pSVar13 = Vector<flatbuffers::Offset<flatbuffers::String>,_unsigned_int>::Get
                                  ((Vector<flatbuffers::Offset<flatbuffers::String>,_unsigned_int> *
                                   )pVStack_f0,local_f4);
              local_308 = (offset_type)FlatBufferBuilderImpl<false>::CreateSharedString(fbb,pSVar13)
              ;
            }
            Offset<const_flatbuffers::String_*>::Offset(&local_f8,local_308);
            pvVar14 = std::
                      vector<flatbuffers::Offset<const_flatbuffers::String_*>,_std::allocator<flatbuffers::Offset<const_flatbuffers::String_*>_>_>
                      ::operator[]((vector<flatbuffers::Offset<const_flatbuffers::String_*>,_std::allocator<flatbuffers::Offset<const_flatbuffers::String_*>_>_>
                                    *)local_e0,(ulong)local_f4);
            pvVar14->o = local_f8.o;
          }
          elements_1.
          super__Vector_base<flatbuffers::Offset<const_flatbuffers::Table_*>,_std::allocator<flatbuffers::Offset<const_flatbuffers::Table_*>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ =
               FlatBufferBuilderImpl<false>::
               CreateVector<flatbuffers::Offset<flatbuffers::String_const*>,std::allocator<flatbuffers::Offset<flatbuffers::String_const*>>>
                         (fbb,(vector<flatbuffers::Offset<const_flatbuffers::String_*>,_std::allocator<flatbuffers::Offset<const_flatbuffers::String_*>_>_>
                               *)local_e0);
          local_84 = (value_type_conflict4)
                     elements_1.
                     super__Vector_base<flatbuffers::Offset<const_flatbuffers::Table_*>,_std::allocator<flatbuffers::Offset<const_flatbuffers::Table_*>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_;
          std::
          vector<flatbuffers::Offset<const_flatbuffers::String_*>,_std::allocator<flatbuffers::Offset<const_flatbuffers::String_*>_>_>
          ::~vector((vector<flatbuffers::Offset<const_flatbuffers::String_*>,_std::allocator<flatbuffers::Offset<const_flatbuffers::String_*>_>_>
                     *)local_e0);
        }
        else if ((BVar4 != Obj) ||
                (bVar2 = reflection::Object::is_struct((Object *)local_2d0), bVar2)) {
          sVar20 = GetTypeSize(BVar4);
          element_alignment = sVar20;
          if ((elements.
               super__Vector_base<flatbuffers::Offset<const_flatbuffers::String_*>,_std::allocator<flatbuffers::Offset<const_flatbuffers::String_*>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage != (pointer)0x0) &&
             (bVar2 = reflection::Object::is_struct
                                ((Object *)
                                 elements.
                                 super__Vector_base<flatbuffers::Offset<const_flatbuffers::String_*>,_std::allocator<flatbuffers::Offset<const_flatbuffers::String_*>_>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage), bVar2)) {
            iVar8 = reflection::Object::bytesize
                              ((Object *)
                               elements.
                               super__Vector_base<flatbuffers::Offset<const_flatbuffers::String_*>,_std::allocator<flatbuffers::Offset<const_flatbuffers::String_*>_>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage);
            element_alignment = (long)iVar8;
          }
          uVar7 = Vector<flatbuffers::Offset<flatbuffers::Table>,_unsigned_int>::size(this_00);
          FlatBufferBuilderImpl<false>::StartVector<flatbuffers::Offset,unsigned_int>
                    (fbb,(ulong)uVar7,element_alignment,sVar20);
          bytes = Vector<flatbuffers::Offset<flatbuffers::Table>,_unsigned_int>::Data(this_00);
          uVar7 = Vector<flatbuffers::Offset<flatbuffers::Table>,_unsigned_int>::size(this_00);
          FlatBufferBuilderImpl<false>::PushBytes(fbb,bytes,element_alignment * uVar7);
          uVar7 = Vector<flatbuffers::Offset<flatbuffers::Table>,_unsigned_int>::size(this_00);
          local_84 = FlatBufferBuilderImpl<false>::EndVector<unsigned_int,unsigned_int>
                               (fbb,(ulong)uVar7);
        }
        else {
          uVar7 = Vector<flatbuffers::Offset<flatbuffers::Table>,_unsigned_int>::size(this_00);
          std::allocator<flatbuffers::Offset<const_flatbuffers::Table_*>_>::allocator(&local_121);
          std::
          vector<flatbuffers::Offset<const_flatbuffers::Table_*>,_std::allocator<flatbuffers::Offset<const_flatbuffers::Table_*>_>_>
          ::vector((vector<flatbuffers::Offset<const_flatbuffers::Table_*>,_std::allocator<flatbuffers::Offset<const_flatbuffers::Table_*>_>_>
                    *)&i_1,(ulong)uVar7,&local_121);
          std::allocator<flatbuffers::Offset<const_flatbuffers::Table_*>_>::~allocator(&local_121);
          for (local_128 = 0;
              uVar7 = Vector<flatbuffers::Offset<flatbuffers::Table>,_unsigned_int>::size(this_00),
              objectdef_00 = elements.
                             super__Vector_base<flatbuffers::Offset<const_flatbuffers::String_*>,_std::allocator<flatbuffers::Offset<const_flatbuffers::String_*>_>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage, local_128 < uVar7;
              local_128 = local_128 + 1) {
            table_00 = Vector<flatbuffers::Offset<flatbuffers::Table>,_unsigned_int>::Get
                                 (this_00,local_128);
            OVar6 = CopyTable(fbb,schema,(Object *)objectdef_00,table_00,
                              (bool)(offsets.
                                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ & 1));
            pvVar15 = std::
                      vector<flatbuffers::Offset<const_flatbuffers::Table_*>,_std::allocator<flatbuffers::Offset<const_flatbuffers::Table_*>_>_>
                      ::operator[]((vector<flatbuffers::Offset<const_flatbuffers::Table_*>,_std::allocator<flatbuffers::Offset<const_flatbuffers::Table_*>_>_>
                                    *)&i_1,(ulong)local_128);
            pvVar15->o = OVar6.o;
          }
          local_84 = (value_type_conflict4)
                     FlatBufferBuilderImpl<false>::
                     CreateVector<flatbuffers::Offset<flatbuffers::Table_const*>,std::allocator<flatbuffers::Offset<flatbuffers::Table_const*>>>
                               (fbb,(vector<flatbuffers::Offset<const_flatbuffers::Table_*>,_std::allocator<flatbuffers::Offset<const_flatbuffers::Table_*>_>_>
                                     *)&i_1);
          std::
          vector<flatbuffers::Offset<const_flatbuffers::Table_*>,_std::allocator<flatbuffers::Offset<const_flatbuffers::Table_*>_>_>
          ::~vector((vector<flatbuffers::Offset<const_flatbuffers::Table_*>,_std::allocator<flatbuffers::Offset<const_flatbuffers::Table_*>_>_>
                     *)&i_1);
        }
        break;
      case Obj:
        pVVar17 = reflection::Schema::objects(schema);
        pTVar16 = reflection::Field::type(pFStack_80);
        pcVar18 = reflection::Type::index(pTVar16,pcVar18,__c);
        this = Vector<flatbuffers::Offset<reflection::Object>,_unsigned_int>::Get
                         (pVVar17,(uint)pcVar18);
        bVar2 = reflection::Object::is_struct(this);
        if (!bVar2) {
          pTVar12 = GetFieldT(table,pFStack_80);
          local_84 = (value_type_conflict4)
                     CopyTable(fbb,schema,this,pTVar12,
                               (bool)(offsets.
                                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ & 1))
          ;
        }
        break;
      case Union:
        objectdef_01 = GetUnionType(schema,objectdef,pFStack_80,table);
        pTVar12 = GetFieldT(table,pFStack_80);
        local_84 = (value_type_conflict4)
                   CopyTable(fbb,schema,objectdef_01,pTVar12,
                             (bool)(offsets.
                                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                    _M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ & 1));
      }
      if (local_84 != 0) {
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&fielddefs,&local_84);
      }
    }
    VectorIterator<flatbuffers::Offset<reflection::Field>,_const_reflection::Field_*,_const_unsigned_char_*,_unsigned_int>
    ::operator++(&local_70);
  }
  bVar2 = reflection::Object::is_struct(objectdef);
  if (bVar2) {
    iVar8 = reflection::Object::minalign(objectdef);
    local_3d8 = FlatBufferBuilderImpl<false>::StartStruct(fbb,(long)iVar8);
  }
  else {
    local_3d8 = FlatBufferBuilderImpl<false>::StartTable(fbb);
  }
  it_1.data_ = (uchar *)0x0;
  Vector<flatbuffers::Offset<reflection::Field>,_unsigned_int>::begin
            ((Vector<flatbuffers::Offset<reflection::Field>,_unsigned_int> *)&local_158);
  do {
    Vector<flatbuffers::Offset<reflection::Field>,_unsigned_int>::end
              ((Vector<flatbuffers::Offset<reflection::Field>,_unsigned_int> *)&fielddef_1);
    bVar2 = VectorIterator<flatbuffers::Offset<reflection::Field>,_const_reflection::Field_*,_const_unsigned_char_*,_unsigned_int>
            ::operator!=(&local_158,
                         (VectorIterator<flatbuffers::Offset<reflection::Field>,_const_reflection::Field_*,_const_unsigned_char_*,_unsigned_int>
                          *)&fielddef_1);
    cVar1 = it_1;
    if (!bVar2) {
      puVar21 = (uchar *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                                   ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                                    &fielddefs);
      if (cVar1.data_ != puVar21) {
        __assert_fail("offset_idx == offsets.size()",
                      "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/src/reflection.cpp"
                      ,0x2e6,
                      "Offset<const Table *> flatbuffers::CopyTable(FlatBufferBuilder &, const reflection::Schema &, const reflection::Object &, const Table &, bool)"
                     );
      }
      bVar2 = reflection::Object::is_struct(objectdef);
      if (bVar2) {
        FlatBufferBuilderImpl<false>::ClearOffsets(fbb);
        uVar10 = FlatBufferBuilderImpl<false>::EndStruct(fbb);
        Offset<const_flatbuffers::Table_*>::Offset
                  ((Offset<const_flatbuffers::Table_*> *)((long)&fbb_local + 4),uVar10);
      }
      else {
        uVar10 = FlatBufferBuilderImpl<false>::EndTable(fbb,local_3d8);
        Offset<const_flatbuffers::Table_*>::Offset
                  ((Offset<const_flatbuffers::Table_*> *)((long)&fbb_local + 4),uVar10);
      }
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&fielddefs);
      return (Offset<const_flatbuffers::Table_*>)fbb_local._4_4_;
    }
    pFStack_168 = VectorIterator<flatbuffers::Offset<reflection::Field>,_const_reflection::Field_*,_const_unsigned_char_*,_unsigned_int>
                  ::operator*(&local_158);
    uVar3 = reflection::Field::offset(pFStack_168);
    pcVar18 = (char *)(ulong)uVar3;
    bVar2 = Table::CheckField(table,uVar3);
    if (!bVar2) goto LAB_001ac5ed;
    pTVar16 = reflection::Field::type(pFStack_168);
    subobjectdef_2._4_4_ = reflection::Type::base_type(pTVar16);
    if (subobjectdef_2._4_4_ - String < 2) {
LAB_001ac53a:
      uVar3 = reflection::Field::offset(pFStack_168);
      cVar1 = it_1;
      it_1.data_ = it_1.data_ + 1;
      pvVar19 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                          ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&fielddefs,
                           (size_type_conflict)cVar1.data_);
      Offset<void>::Offset((Offset<void> *)((long)&size + 4),*pvVar19);
      FlatBufferBuilderImpl<false>::AddOffset<void>(fbb,uVar3,size._4_4_);
    }
    else if (subobjectdef_2._4_4_ == Obj) {
      pVVar17 = reflection::Schema::objects(schema);
      pTVar16 = reflection::Field::type(pFStack_168);
      pcVar18 = reflection::Type::index(pTVar16,pcVar18,__c_01);
      local_178 = Vector<flatbuffers::Offset<reflection::Object>,_unsigned_int>::Get
                            (pVVar17,(uint)pcVar18);
      bVar2 = reflection::Object::is_struct(local_178);
      fielddef_00 = pFStack_168;
      if (!bVar2) goto LAB_001ac53a;
      iVar8 = reflection::Object::minalign(local_178);
      iVar9 = reflection::Object::bytesize(local_178);
      anon_unknown_96::CopyInline(fbb,fielddef_00,table,(long)iVar8,(long)iVar9);
    }
    else {
      if (subobjectdef_2._4_4_ == Union) goto LAB_001ac53a;
      sVar20 = GetTypeSize(subobjectdef_2._4_4_);
      anon_unknown_96::CopyInline(fbb,pFStack_168,table,sVar20,sVar20);
    }
LAB_001ac5ed:
    VectorIterator<flatbuffers::Offset<reflection::Field>,_const_reflection::Field_*,_const_unsigned_char_*,_unsigned_int>
    ::operator++(&local_158);
  } while( true );
}

Assistant:

Offset<const Table *> CopyTable(FlatBufferBuilder &fbb,
                                const reflection::Schema &schema,
                                const reflection::Object &objectdef,
                                const Table &table, bool use_string_pooling) {
  // Before we can construct the table, we have to first generate any
  // subobjects, and collect their offsets.
  std::vector<uoffset_t> offsets;
  auto fielddefs = objectdef.fields();
  for (auto it = fielddefs->begin(); it != fielddefs->end(); ++it) {
    auto &fielddef = **it;
    // Skip if field is not present in the source.
    if (!table.CheckField(fielddef.offset())) continue;
    uoffset_t offset = 0;
    switch (fielddef.type()->base_type()) {
      case reflection::String: {
        offset = use_string_pooling
                     ? fbb.CreateSharedString(GetFieldS(table, fielddef)).o
                     : fbb.CreateString(GetFieldS(table, fielddef)).o;
        break;
      }
      case reflection::Obj: {
        auto &subobjectdef = *schema.objects()->Get(fielddef.type()->index());
        if (!subobjectdef.is_struct()) {
          offset = CopyTable(fbb, schema, subobjectdef,
                             *GetFieldT(table, fielddef), use_string_pooling)
                       .o;
        }
        break;
      }
      case reflection::Union: {
        auto &subobjectdef = GetUnionType(schema, objectdef, fielddef, table);
        offset = CopyTable(fbb, schema, subobjectdef,
                           *GetFieldT(table, fielddef), use_string_pooling)
                     .o;
        break;
      }
      case reflection::Vector: {
        auto vec =
            table.GetPointer<const Vector<Offset<Table>> *>(fielddef.offset());
        auto element_base_type = fielddef.type()->element();
        auto elemobjectdef =
            element_base_type == reflection::Obj
                ? schema.objects()->Get(fielddef.type()->index())
                : nullptr;
        switch (element_base_type) {
          case reflection::String: {
            std::vector<Offset<const String *>> elements(vec->size());
            auto vec_s = reinterpret_cast<const Vector<Offset<String>> *>(vec);
            for (uoffset_t i = 0; i < vec_s->size(); i++) {
              elements[i] = use_string_pooling
                                ? fbb.CreateSharedString(vec_s->Get(i)).o
                                : fbb.CreateString(vec_s->Get(i)).o;
            }
            offset = fbb.CreateVector(elements).o;
            break;
          }
          case reflection::Obj: {
            if (!elemobjectdef->is_struct()) {
              std::vector<Offset<const Table *>> elements(vec->size());
              for (uoffset_t i = 0; i < vec->size(); i++) {
                elements[i] = CopyTable(fbb, schema, *elemobjectdef,
                                        *vec->Get(i), use_string_pooling);
              }
              offset = fbb.CreateVector(elements).o;
              break;
            }
          }
            FLATBUFFERS_FALLTHROUGH();  // fall thru
          default: {                    // Scalars and structs.
            auto element_size = GetTypeSize(element_base_type);
            auto element_alignment = element_size;  // For primitive elements
            if (elemobjectdef && elemobjectdef->is_struct())
              element_size = elemobjectdef->bytesize();
            fbb.StartVector(vec->size(), element_size, element_alignment);
            fbb.PushBytes(vec->Data(), element_size * vec->size());
            offset = fbb.EndVector(vec->size());
            break;
          }
        }
        break;
      }
      default:  // Scalars.
        break;
    }
    if (offset) { offsets.push_back(offset); }
  }
  // Now we can build the actual table from either offsets or scalar data.
  auto start = objectdef.is_struct() ? fbb.StartStruct(objectdef.minalign())
                                     : fbb.StartTable();
  size_t offset_idx = 0;
  for (auto it = fielddefs->begin(); it != fielddefs->end(); ++it) {
    auto &fielddef = **it;
    if (!table.CheckField(fielddef.offset())) continue;
    auto base_type = fielddef.type()->base_type();
    switch (base_type) {
      case reflection::Obj: {
        auto &subobjectdef = *schema.objects()->Get(fielddef.type()->index());
        if (subobjectdef.is_struct()) {
          CopyInline(fbb, fielddef, table, subobjectdef.minalign(),
                     subobjectdef.bytesize());
          break;
        }
      }
        FLATBUFFERS_FALLTHROUGH();  // fall thru
      case reflection::Union:
      case reflection::String:
      case reflection::Vector:
        fbb.AddOffset(fielddef.offset(), Offset<void>(offsets[offset_idx++]));
        break;
      default: {  // Scalars.
        auto size = GetTypeSize(base_type);
        CopyInline(fbb, fielddef, table, size, size);
        break;
      }
    }
  }
  FLATBUFFERS_ASSERT(offset_idx == offsets.size());
  if (objectdef.is_struct()) {
    fbb.ClearOffsets();
    return fbb.EndStruct();
  } else {
    return fbb.EndTable(start);
  }
}